

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,NumeralExpression *expression)

{
  PrimitiveSimpleObject *this_00;
  Type *this_01;
  allocator<char> local_59;
  VariableValue *local_58;
  string local_50;
  
  local_58 = (VariableValue *)operator_new(0x50);
  this_00 = (PrimitiveSimpleObject *)operator_new(0x18);
  this_01 = (Type *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"int",&local_59);
  Type::Type(this_01,&local_50);
  PrimitiveSimpleObject::PrimitiveSimpleObject(this_00,this_01);
  VariableValue::VariableValue(local_58,this_00,expression->value_);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = &local_58->super_Value;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(NumeralExpression* expression) {
  tos_value_ = new VariableValue(new PrimitiveSimpleObject(new Type("int")),
                                 expression->value_);
}